

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<std::complex<double>_>::PrintGlobal
          (TPZFrontNonSym<std::complex<double>_> *this,char *name,ostream *out)

{
  long *plVar1;
  long lVar2;
  char cVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (name == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar4 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar4);
  }
  cVar3 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  lVar6 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
  if (0 < lVar6) {
    lVar8 = 0;
    do {
      if ((this->super_TPZFront<std::complex<double>_>).fLocal.fStore[lVar8] != -1) {
        poVar5 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        lVar6 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < lVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  lVar6 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
  if (0 < lVar6) {
    lVar8 = 0;
    do {
      if ((this->super_TPZFront<std::complex<double>_>).fLocal.fStore[lVar8] != -1) {
        if (0 < lVar6) {
          lVar7 = 0;
          do {
            plVar1 = (this->super_TPZFront<std::complex<double>_>).fLocal.fStore;
            lVar2 = plVar1[lVar7];
            if (lVar2 != -1) {
              poVar5 = std::operator<<(out,(complex *)
                                           ((this->super_TPZFront<std::complex<double>_>).fData.
                                            fStore + lVar2 * (this->
                                                  super_TPZFront<std::complex<double>_>).fMaxFront +
                                                  plVar1[lVar8]));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              lVar6 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < lVar6);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        lVar6 = (this->super_TPZFront<std::complex<double>_>).fLocal.fNElements;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < lVar6);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::PrintGlobal(const char *name, std::ostream& out){
	int64_t i, j;
	out << name << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]!=-1) out << i << " ";
	}
	out << endl;
	for(i=0;i<this->fLocal.NElements();i++){
		if(this->fLocal[i]==-1) continue;
		for(j=0;j<this->fLocal.NElements();j++){
			if(this->fLocal[j]==-1) continue;
			out << Element(this->fLocal[i],this->fLocal[j]) << " ";
		}
		out << endl;
	}
	out << endl;
	out.flush();
}